

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  allocator local_11;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_0014e590;
  std::__cxx11::string::string((string *)&this->output_file_,output_file,&local_11);
  if (((this->output_file_)._M_dataplus._M_p != (pointer)0x0) &&
     ((this->output_file_)._M_string_length != 0)) {
    return;
  }
  fwrite("XML output file may not be null\n",0x20,1,_stderr);
  fflush(_stderr);
  exit(1);
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.c_str() == NULL || output_file_.empty()) {
    fprintf(stderr, "XML output file may not be null\n");
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
}